

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrExternalCameraExtrinsicsOCULUS *value
               ,string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrExternalCameraAttachedToDeviceOCULUS XVar3;
  pointer pcVar4;
  XrExternalCameraAttachedToDeviceOCULUS __val;
  uint uVar5;
  char cVar6;
  bool bVar7;
  char *pcVar8;
  invalid_argument *this;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  char cVar15;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string camerastatusflags_prefix;
  string lastchangetime_prefix;
  string relativepose_prefix;
  string attachedtodevice_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  paVar1 = &local_d0.field_2;
  local_f0._M_dataplus._M_p = (pointer)value;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\x12');
  *local_d0._M_dataplus._M_p = '0';
  local_d0._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_d0._M_dataplus._M_p + (local_d0._M_string_length - 1);
  lVar10 = 0;
  do {
    bVar2 = *(byte *)((long)&local_f0._M_dataplus._M_p + lVar10);
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar10 = lVar10 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar10 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_d0);
  uVar13 = value->lastChangeTime;
  uVar12 = -uVar13;
  if (0 < (long)uVar13) {
    uVar12 = uVar13;
  }
  uVar14 = 1;
  if (9 < uVar12) {
    uVar11 = uVar12;
    uVar5 = 4;
    do {
      uVar14 = uVar5;
      if (uVar11 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_001d5f2c;
      }
      if (uVar11 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_001d5f2c;
      }
      if (uVar11 < 10000) goto LAB_001d5f2c;
      bVar7 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar5 = uVar14 + 4;
    } while (bVar7);
    uVar14 = uVar14 + 1;
  }
LAB_001d5f2c:
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar14 - (char)((long)uVar13 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_f0._M_dataplus._M_p + -((long)uVar13 >> 0x3f),uVar14,uVar12);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  uVar13 = value->cameraStatusFlags;
  cVar15 = '\x01';
  if (9 < uVar13) {
    uVar12 = uVar13;
    cVar6 = '\x04';
    do {
      cVar15 = cVar6;
      if (uVar12 < 100) {
        cVar15 = cVar15 + -2;
        goto LAB_001d601c;
      }
      if (uVar12 < 1000) {
        cVar15 = cVar15 + -1;
        goto LAB_001d601c;
      }
      if (uVar12 < 10000) goto LAB_001d601c;
      bVar7 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar6 = cVar15 + '\x04';
    } while (bVar7);
    cVar15 = cVar15 + '\x01';
  }
LAB_001d601c:
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar15);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar13);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[34],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [34])"XrExternalCameraStatusFlagsOCULUS",&local_f0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  XVar3 = value->attachedToDevice;
  __val = -XVar3;
  if (0 < (int)XVar3) {
    __val = XVar3;
  }
  uVar14 = 1;
  if (9 < __val) {
    uVar13 = (ulong)__val;
    uVar5 = 4;
    do {
      uVar14 = uVar5;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_001d60fe;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_001d60fe;
      }
      if (uVar9 < 10000) goto LAB_001d60fe;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_001d60fe:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar14 - (char)((int)XVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_b0._M_dataplus._M_p + (XVar3 >> 0x1f),uVar14,__val);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[39],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [39])"XrExternalCameraAttachedToDeviceOCULUS",&local_90,&local_b0
            );
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_70;
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)gen_dispatch_table_00,"XrPosef","");
  bVar7 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->relativePose,&local_50,(string *)local_70,false,
                     contents);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_60._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrExternalCameraExtrinsicsOCULUS* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string lastchangetime_prefix = prefix;
        lastchangetime_prefix += "lastChangeTime";
        contents.emplace_back("XrTime", lastchangetime_prefix, std::to_string(value->lastChangeTime));
        std::string camerastatusflags_prefix = prefix;
        camerastatusflags_prefix += "cameraStatusFlags";
        contents.emplace_back("XrExternalCameraStatusFlagsOCULUS", camerastatusflags_prefix, std::to_string(value->cameraStatusFlags));
        std::string attachedtodevice_prefix = prefix;
        attachedtodevice_prefix += "attachedToDevice";
        contents.emplace_back("XrExternalCameraAttachedToDeviceOCULUS", attachedtodevice_prefix, std::to_string(value->attachedToDevice));
        std::string relativepose_prefix = prefix;
        relativepose_prefix += "relativePose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->relativePose, relativepose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}